

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FSoundID,_FSoundID>::DoCopy
          (TArray<FSoundID,_FSoundID> *this,TArray<FSoundID,_FSoundID> *other)

{
  uint uVar1;
  FSoundID *pFVar2;
  FSoundID *pFVar3;
  ulong uVar4;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (FSoundID *)0x0;
  }
  else {
    pFVar3 = (FSoundID *)
             M_Malloc_Dbg((ulong)uVar1 << 2,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                          ,0x19e);
    this->Array = pFVar3;
    uVar1 = this->Count;
    if ((ulong)uVar1 != 0) {
      pFVar2 = other->Array;
      uVar4 = 0;
      do {
        pFVar3[uVar4].ID = pFVar2[uVar4].ID;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}